

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  IRIns *refb_local;
  IRIns *refa_local;
  jit_State *J_local;
  
  if ((refa->field_0).op2 == (refb->field_0).op2) {
    if ((refa->field_0).op1 == (refb->field_0).op1) {
      J_local._4_4_ = ALIAS_MUST;
    }
    else if (((refa->field_0).op2 < 7) || (0xc < (refa->field_0).op2)) {
      J_local._4_4_ = ALIAS_MAY;
    }
    else {
      J_local._4_4_ = aa_table(J,(uint)(refa->field_0).op1,(uint)(refb->field_0).op1);
    }
  }
  else {
    J_local._4_4_ = ALIAS_NO;
  }
  return J_local._4_4_;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}